

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

RtreeSearchPoint * rtreeEnqueue(RtreeCursor *pCur,RtreeDValue rScore,u8 iLevel)

{
  RtreeSearchPoint *pRVar1;
  long lVar2;
  int iVar3;
  RtreeSearchPoint *pRVar4;
  ulong uVar5;
  uint i;
  bool bVar6;
  
  if (pCur->nPointAlloc <= pCur->nPoint) {
    lVar2 = (long)pCur->nPointAlloc * 2 + 8;
    pRVar4 = pCur->aPoint;
    iVar3 = sqlite3_initialize();
    if (iVar3 == 0) {
      pRVar4 = (RtreeSearchPoint *)sqlite3Realloc(pRVar4,lVar2 * 0x18);
    }
    else {
      pRVar4 = (RtreeSearchPoint *)0x0;
    }
    if (pRVar4 == (RtreeSearchPoint *)0x0) {
      return (RtreeSearchPoint *)0x0;
    }
    pCur->aPoint = pRVar4;
    pCur->nPointAlloc = (int)lVar2;
  }
  uVar5 = (ulong)pCur->nPoint;
  pCur->nPoint = pCur->nPoint + 1;
  pRVar4 = pCur->aPoint + uVar5;
  pRVar4->rScore = rScore;
  pRVar4->iLevel = iLevel;
  while( true ) {
    iVar3 = (int)uVar5;
    if (iVar3 < 1) {
      return pRVar4;
    }
    i = iVar3 - 1U >> 1;
    uVar5 = (ulong)i;
    pRVar1 = pCur->aPoint + uVar5;
    if (pRVar1->rScore <= pRVar4->rScore) {
      bVar6 = true;
      if (pRVar4->rScore <= pRVar1->rScore) {
        bVar6 = pRVar1->iLevel <= pRVar4->iLevel;
      }
    }
    else {
      bVar6 = false;
    }
    if (bVar6) break;
    rtreeSearchPointSwap(pCur,i,iVar3);
    pRVar4 = pRVar1;
  }
  return pRVar4;
}

Assistant:

static RtreeSearchPoint *rtreeEnqueue(
  RtreeCursor *pCur,    /* The cursor */
  RtreeDValue rScore,   /* Score for the new search point */
  u8 iLevel             /* Level for the new search point */
){
  int i, j;
  RtreeSearchPoint *pNew;
  if( pCur->nPoint>=pCur->nPointAlloc ){
    int nNew = pCur->nPointAlloc*2 + 8;
    pNew = sqlite3_realloc64(pCur->aPoint, nNew*sizeof(pCur->aPoint[0]));
    if( pNew==0 ) return 0;
    pCur->aPoint = pNew;
    pCur->nPointAlloc = nNew;
  }
  i = pCur->nPoint++;
  pNew = pCur->aPoint + i;
  pNew->rScore = rScore;
  pNew->iLevel = iLevel;
  assert( iLevel<=RTREE_MAX_DEPTH );
  while( i>0 ){
    RtreeSearchPoint *pParent;
    j = (i-1)/2;
    pParent = pCur->aPoint + j;
    if( rtreeSearchPointCompare(pNew, pParent)>=0 ) break;
    rtreeSearchPointSwap(pCur, j, i);
    i = j;
    pNew = pParent;
  }
  return pNew;
}